

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cli_parser.cpp
# Opt level: O3

int __thiscall Fossilize::CLIParser::next_sint(CLIParser *this)

{
  uint uVar1;
  _Hash_node_base *p_Var2;
  _Hash_node_base *p_Var3;
  CLIParser *__nptr;
  string *psVar4;
  string *psVar5;
  int *piVar6;
  char *extraout_RAX;
  ulong __code;
  __node_base_ptr p_Var7;
  int iVar8;
  CLIParser *unaff_RBX;
  ulong unaff_RBP;
  key_type *in_RSI;
  char *pcVar9;
  char *pcVar10;
  key_type *unaff_R13;
  string *unaff_R14;
  uint *unaff_R15;
  allocator aStack_129;
  double dStack_128;
  undefined1 auStack_120 [8];
  char *pcStack_118;
  char acStack_108 [16];
  CLIParser *pCStack_f8;
  string *psStack_e8;
  uint *puStack_e0;
  code *pcStack_d8;
  allocator aStack_c1;
  undefined1 auStack_c0 [8];
  char *pcStack_b8;
  char acStack_a8 [16];
  CLIParser *pCStack_98;
  key_type *pkStack_88;
  string *psStack_80;
  uint *puStack_78;
  ulong uStack_70;
  allocator local_59;
  undefined1 local_58 [8];
  CLIParser *local_50;
  undefined8 local_40;
  
  if (this->argc == 0) {
    uStack_70 = 0x146256;
    next_sint();
LAB_00146256:
    psVar4 = unaff_R14;
    pcVar10 = "stol";
    uStack_70 = 0x146262;
    std::__throw_invalid_argument("stol");
  }
  else {
    uStack_70 = 0x1461c5;
    std::__cxx11::string::string((string *)&local_50,*this->argv,&local_59);
    __nptr = local_50;
    uStack_70 = 0x1461cd;
    unaff_R15 = (uint *)__errno_location();
    uVar1 = *unaff_R15;
    unaff_RBP = (ulong)uVar1;
    *unaff_R15 = 0;
    unaff_R13 = (key_type *)local_58;
    uStack_70 = 0x1461ed;
    in_RSI = unaff_R13;
    psVar4 = (string *)strtol((char *)__nptr,(char **)unaff_R13,10);
    unaff_RBX = this;
    unaff_R14 = (string *)&local_50;
    if (local_58 == (undefined1  [8])__nptr) goto LAB_00146256;
    if (*unaff_R15 == 0) {
LAB_0014620e:
      *unaff_R15 = uVar1;
    }
    else if (*unaff_R15 == 0x22) {
      uStack_70 = 0x14620e;
      std::__throw_out_of_range("stol");
      goto LAB_0014620e;
    }
    if (local_50 != (CLIParser *)&stack0xffffffffffffffc0) {
      in_RSI = (key_type *)(local_40 + 1);
      uStack_70 = 0x14622c;
      operator_delete(local_50,(ulong)in_RSI);
    }
    pcVar10 = (char *)local_50;
    if ((string *)(long)(int)psVar4 == psVar4) {
      this->argc = this->argc + -1;
      this->argv = this->argv + 1;
      return (int)psVar4;
    }
  }
  uStack_70 = 0x146267;
  next_sint();
  pCStack_98 = unaff_RBX;
  pkStack_88 = unaff_R13;
  psStack_80 = psVar4;
  puStack_78 = unaff_R15;
  uStack_70 = unaff_RBP;
  if (((CLIParser *)pcVar10)->argc == 0) {
    pcStack_d8 = (code *)0x146331;
    next_uint();
LAB_00146331:
    psVar5 = psVar4;
    pcVar9 = "stoul";
    pcStack_d8 = (code *)0x14633d;
    std::__throw_invalid_argument("stoul");
  }
  else {
    pcStack_d8 = (code *)0x14629f;
    std::__cxx11::string::string((string *)&pcStack_b8,*((CLIParser *)pcVar10)->argv,&aStack_c1);
    pcVar9 = pcStack_b8;
    pcStack_d8 = (code *)0x1462a7;
    unaff_R15 = (uint *)__errno_location();
    uVar1 = *unaff_R15;
    unaff_RBP = (ulong)uVar1;
    *unaff_R15 = 0;
    in_RSI = (key_type *)auStack_c0;
    pcStack_d8 = (code *)0x1462c7;
    psVar5 = (string *)strtoul(pcVar9,(char **)in_RSI,10);
    unaff_RBX = (CLIParser *)pcVar10;
    psVar4 = (string *)&pcStack_b8;
    if (auStack_c0 == (undefined1  [8])pcVar9) goto LAB_00146331;
    if (*unaff_R15 == 0) {
LAB_001462e8:
      *unaff_R15 = uVar1;
    }
    else if (*unaff_R15 == 0x22) {
      pcStack_d8 = (code *)0x1462e8;
      std::__throw_out_of_range("stoul");
      goto LAB_001462e8;
    }
    if (pcStack_b8 != acStack_a8) {
      in_RSI = (key_type *)(acStack_a8._0_8_ + 1);
      pcStack_d8 = (code *)0x146306;
      operator_delete(pcStack_b8,(ulong)in_RSI);
    }
    pcVar9 = pcStack_b8;
    if ((ulong)psVar5 >> 0x20 == 0) {
      ((CLIParser *)pcVar10)->argc = ((CLIParser *)pcVar10)->argc + -1;
      ((CLIParser *)pcVar10)->argv = ((CLIParser *)pcVar10)->argv + 1;
      return (int)psVar5;
    }
  }
  pcStack_d8 = next_double;
  next_uint();
  pCStack_f8 = unaff_RBX;
  psStack_e8 = psVar5;
  puStack_e0 = unaff_R15;
  pcStack_d8 = (code *)unaff_RBP;
  if (*(int *)(pcVar9 + 0x78) == 0) {
    next_double();
LAB_001463ff:
    pcVar10 = "stod";
    std::__throw_invalid_argument("stod");
    iVar8 = (int)((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Fossilize::CLIParser_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Fossilize::CLIParser_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)((long)pcVar10 + 0x70))->_M_bucket_count;
    if (iVar8 != 0) {
      p_Var2 = (((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Fossilize::CLIParser_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Fossilize::CLIParser_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)((long)pcVar10 + 0x70))->_M_before_begin)._M_nxt;
      p_Var3 = p_Var2->_M_nxt;
      *(int *)&((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Fossilize::CLIParser_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Fossilize::CLIParser_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)((long)pcVar10 + 0x70))->_M_bucket_count = iVar8 + -1;
      (((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Fossilize::CLIParser_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Fossilize::CLIParser_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
         *)((long)pcVar10 + 0x70))->_M_before_begin)._M_nxt = p_Var2 + 1;
      return (int)p_Var3;
    }
    next_string();
    __code = std::_Hash_bytes((in_RSI->_M_dataplus)._M_p,in_RSI->_M_string_length,0xc70f6907);
    iVar8 = 0;
    p_Var7 = std::
             _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Fossilize::CLIParser_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Fossilize::CLIParser_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             ::_M_find_before_node
                       ((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Fossilize::CLIParser_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Fossilize::CLIParser_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         *)pcVar10,
                        __code % ((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Fossilize::CLIParser_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Fossilize::CLIParser_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                                   *)pcVar10)->_M_bucket_count,in_RSI,__code);
    if (p_Var7 != (__node_base_ptr)0x0) {
      iVar8 = (int)p_Var7->_M_nxt;
    }
    return iVar8;
  }
  std::__cxx11::string::string
            ((string *)&pcStack_118,(char *)**(undefined8 **)(pcVar9 + 0x80),&aStack_129);
  pcVar10 = pcStack_118;
  piVar6 = __errno_location();
  iVar8 = *piVar6;
  *piVar6 = 0;
  in_RSI = (key_type *)auStack_120;
  dStack_128 = strtod(pcVar10,(char **)in_RSI);
  if (auStack_120 == (undefined1  [8])pcVar10) goto LAB_001463ff;
  if (*piVar6 != 0) {
    if (*piVar6 != 0x22) goto LAB_001463bb;
    dStack_128 = (double)std::__throw_out_of_range("stod");
  }
  *piVar6 = iVar8;
LAB_001463bb:
  pcVar10 = acStack_108;
  if (pcStack_118 != pcVar10) {
    operator_delete(pcStack_118,acStack_108._0_8_ + 1);
    pcVar10 = extraout_RAX;
  }
  *(int *)(pcVar9 + 0x78) = *(int *)(pcVar9 + 0x78) + -1;
  *(long *)(pcVar9 + 0x80) = *(long *)(pcVar9 + 0x80) + 8;
  return (int)pcVar10;
}

Assistant:

int CLIParser::next_sint()
{
	if (!argc)
	{
		LOGE("Tried to parse sint, but nothing left in arguments.\n");
		exit(EXIT_FAILURE);
	}

	auto val = stol(*argv);
	if (val > numeric_limits<int>::max() || val < numeric_limits<int>::min())
	{
		LOGE("next_sint() out of range.\n");
		exit(EXIT_FAILURE);
	}

	argc--;
	argv++;

	return int(val);
}